

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O1

void fast_fftfilt(double *x,int x_length,double *h,int h_length,int fft_size,
                 ForwardRealFFT *forward_real_fft,InverseRealFFT *inverse_real_fft,double *y)

{
  double *pdVar1;
  fft_complex *padVar2;
  fft_complex *padVar3;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  void *pvVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double *unaff_RBX;
  uint uVar8;
  fft_plan *pfVar9;
  fft_plan *pfVar10;
  undefined8 *puVar11;
  byte bVar12;
  double dVar13;
  undefined8 auStackY_98 [5];
  undefined1 in_stack_ffffffffffffff90 [32];
  InverseRealFFT *pIVar14;
  
  uVar5 = CONCAT44(in_register_0000000c,h_length);
  bVar12 = 0;
  uVar7 = 0xffffffffffffffff;
  if (-1 < fft_size) {
    uVar7 = (long)fft_size << 4;
  }
  pvVar4 = operator_new__(uVar7);
  dVar13 = (double)fft_size;
  if (0 < x_length) {
    pdVar1 = forward_real_fft->waveform;
    uVar7 = 0;
    do {
      pdVar1[uVar7] = x[uVar7] / dVar13;
      uVar7 = uVar7 + 1;
    } while ((uint)x_length != uVar7);
  }
  if (x_length < fft_size) {
    memset(forward_real_fft->waveform + x_length,0,(ulong)(uint)(~x_length + fft_size) * 8 + 8);
  }
  pfVar10 = &forward_real_fft->forward_fft;
  pfVar9 = pfVar10;
  puVar11 = auStackY_98;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar11 = *(undefined8 *)pfVar9;
    pfVar9 = (fft_plan *)((long)pfVar9 + (ulong)bVar12 * -0x10 + 8);
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  p.c_out = (fft_complex *)forward_real_fft;
  p.n = in_stack_ffffffffffffff90._0_4_;
  p.sign = in_stack_ffffffffffffff90._4_4_;
  p.flags = in_stack_ffffffffffffff90._8_4_;
  p._12_4_ = in_stack_ffffffffffffff90._12_4_;
  p.c_in = (fft_complex *)in_stack_ffffffffffffff90._16_8_;
  p.in = (double *)in_stack_ffffffffffffff90._24_8_;
  p.out = (double *)dVar13;
  p.input = (double *)uVar5;
  p.ip = &inverse_real_fft->fft_size;
  p.w = unaff_RBX;
  fft_execute(p);
  if (-2 < fft_size) {
    padVar2 = forward_real_fft->spectrum;
    lVar6 = 0;
    do {
      *(undefined8 *)((long)pvVar4 + lVar6) = *(undefined8 *)((long)*padVar2 + lVar6);
      *(undefined8 *)((long)pvVar4 + lVar6 + 8) = *(undefined8 *)((long)*padVar2 + lVar6 + 8);
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(fft_size / 2 + 1) << 4 != lVar6);
  }
  uVar8 = (uint)uVar5;
  if (0 < (int)uVar8) {
    pdVar1 = forward_real_fft->waveform;
    uVar7 = 0;
    do {
      pdVar1[uVar7] = h[uVar7] / dVar13;
      uVar7 = uVar7 + 1;
    } while ((uVar5 & 0xffffffff) != uVar7);
  }
  if ((int)uVar8 < fft_size) {
    memset(forward_real_fft->waveform + (int)uVar8,0,(ulong)(~uVar8 + fft_size) * 8 + 8);
  }
  puVar11 = auStackY_98;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar11 = *(undefined8 *)pfVar10;
    pfVar10 = (fft_plan *)((long)pfVar10 + (ulong)bVar12 * -0x10 + 8);
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  p_00.c_out = (fft_complex *)forward_real_fft;
  p_00.n = in_stack_ffffffffffffff90._0_4_;
  p_00.sign = in_stack_ffffffffffffff90._4_4_;
  p_00.flags = in_stack_ffffffffffffff90._8_4_;
  p_00._12_4_ = in_stack_ffffffffffffff90._12_4_;
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffff90._16_8_;
  p_00.in = (double *)in_stack_ffffffffffffff90._24_8_;
  p_00.out = (double *)dVar13;
  p_00.input = (double *)uVar5;
  p_00.ip = &inverse_real_fft->fft_size;
  p_00.w = unaff_RBX;
  fft_execute(p_00);
  if (-2 < fft_size) {
    padVar2 = forward_real_fft->spectrum;
    padVar3 = inverse_real_fft->spectrum;
    lVar6 = 0;
    do {
      *(double *)((long)*padVar3 + lVar6) =
           *(double *)((long)pvVar4 + lVar6) * *(double *)((long)*padVar2 + lVar6) -
           *(double *)((long)*padVar2 + lVar6 + 8) * *(double *)((long)pvVar4 + lVar6 + 8);
      *(double *)((long)*padVar3 + lVar6 + 8) =
           *(double *)((long)pvVar4 + lVar6) * *(double *)((long)*padVar2 + lVar6 + 8) +
           *(double *)((long)pvVar4 + lVar6 + 8) * *(double *)((long)*padVar2 + lVar6);
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(uint)(fft_size / 2) * 0x10 + 0x10 != lVar6);
  }
  pfVar10 = &inverse_real_fft->inverse_fft;
  puVar11 = auStackY_98;
  pIVar14 = inverse_real_fft;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar11 = *(undefined8 *)pfVar10;
    pfVar10 = (fft_plan *)((long)pfVar10 + (ulong)bVar12 * -0x10 + 8);
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  p_01.c_out = (fft_complex *)forward_real_fft;
  p_01.n = in_stack_ffffffffffffff90._0_4_;
  p_01.sign = in_stack_ffffffffffffff90._4_4_;
  p_01.flags = in_stack_ffffffffffffff90._8_4_;
  p_01._12_4_ = in_stack_ffffffffffffff90._12_4_;
  p_01.c_in = (fft_complex *)in_stack_ffffffffffffff90._16_8_;
  p_01.in = (double *)in_stack_ffffffffffffff90._24_8_;
  p_01.out = (double *)dVar13;
  p_01.input = (double *)uVar5;
  p_01.ip = &pIVar14->fft_size;
  p_01.w = unaff_RBX;
  fft_execute(p_01);
  if (0 < fft_size) {
    pdVar1 = inverse_real_fft->waveform;
    uVar7 = 0;
    do {
      y[uVar7] = pdVar1[uVar7];
      uVar7 = uVar7 + 1;
    } while ((uint)fft_size != uVar7);
  }
  operator_delete__(pvVar4);
  return;
}

Assistant:

void fast_fftfilt(const double *x, int x_length, const double *h, int h_length,
    int fft_size, const ForwardRealFFT *forward_real_fft,
    const InverseRealFFT *inverse_real_fft, double *y) {
  fft_complex *x_spectrum = new fft_complex[fft_size];

  for (int i = 0; i < x_length; ++i)
    forward_real_fft->waveform[i] = x[i] / fft_size;
  for (int i = x_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i) {
    x_spectrum[i][0] = forward_real_fft->spectrum[i][0];
    x_spectrum[i][1] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < h_length; ++i)
    forward_real_fft->waveform[i] = h[i] / fft_size;
  for (int i = h_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);

  for (int i = 0; i <= fft_size / 2; ++i) {
    inverse_real_fft->spectrum[i][0] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][0] -
      x_spectrum[i][1] * forward_real_fft->spectrum[i][1];
    inverse_real_fft->spectrum[i][1] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][1] +
      x_spectrum[i][1] * forward_real_fft->spectrum[i][0];
  }
  fft_execute(inverse_real_fft->inverse_fft);

  for (int i = 0; i < fft_size; ++i)
    y[i] = inverse_real_fft->waveform[i];

  delete[] x_spectrum;
}